

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

size_t __thiscall
ddd::DaTrie<false,_false,_true>::edge_size_
          (DaTrie<false,_false,_true> *this,uint32_t node_pos,size_t upper)

{
  pointer pBVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t label;
  uint uVar4;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = SUB84(pBVar1[node_pos],0);
  if ((-1 < (int)uVar3) && (uVar4 = 0, uVar3 != 0x7fffffff)) {
    uVar2 = 0;
    while (((*(uint *)&pBVar1[uVar4 ^ uVar3].field_0x4 & 0x7fffffff) != node_pos ||
           (uVar2 = uVar2 + 1, uVar2 < upper))) {
      uVar4 = uVar4 + 1;
      if (uVar4 == 0x100) {
        return uVar2;
      }
    }
    return uVar2;
  }
  return 0;
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }